

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::ConcatenationExpression>
          (ConstraintExprVisitor *this,ConcatenationExpression *expr)

{
  int iVar1;
  size_t sVar2;
  pointer ppEVar3;
  Expression *pEVar4;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  RandMode RVar9;
  ExpressionKind EVar10;
  SubroutineKind SVar11;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar12;
  byte bVar13;
  SourceLocation SVar14;
  DiagCode code;
  ASTContext *this_00;
  BinaryExpression *binExpr;
  long lVar16;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  byte local_33;
  SourceLocation SVar15;
  
  if ((this->failed != false) || (bVar7 = Expression::bad(&expr->super_Expression), bVar7))
  goto LAB_00309492;
  symbol = Expression::getSymbolReference(&expr->super_Expression,true);
  if ((symbol != (Symbol *)0x0) &&
     (((RVar9 = ASTContext::getRandMode(this->context,symbol), RVar9 != None &&
       (this->sawRandVars = true, RVar9 == RandC)) && (this->isSoft != false)))) {
    ASTContext::addDiag(this->context,(DiagCode)0x390008,(expr->super_Expression).sourceRange);
  }
  EVar10 = (expr->super_Expression).kind;
  if ((EVar10 < Conversion) && ((0x340000U >> (EVar10 & ValueRange) & 1) != 0)) {
    bVar13 = 0;
  }
  else {
    bVar7 = this->isTop;
    bVar8 = this->sawRandVars;
    this->isTop = false;
    this->sawRandVars = false;
    sVar2 = (expr->operands_)._M_extent._M_extent_value;
    if (sVar2 == 0) {
      bVar13 = 0;
    }
    else {
      ppEVar3 = (expr->operands_)._M_ptr;
      lVar16 = 0;
      do {
        pEVar4 = *(Expression **)((long)ppEVar3 + lVar16);
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                  (pEVar4,pEVar4,this);
        lVar16 = lVar16 + 8;
      } while (sVar2 << 3 != lVar16);
      bVar13 = this->sawRandVars;
      EVar10 = (expr->super_Expression).kind;
    }
    this->isTop = bVar7;
    this->sawRandVars = bVar8;
  }
  bVar7 = true;
  switch(EVar10) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_40,(SVIntStorage *)&(expr->operands_)._M_extent);
    goto LAB_00309385;
  case RealLiteral:
  case TimeLiteral:
    this_00 = this->context;
    if (0 < (int)(((this_00->scope).ptr)->compilation->options).languageVersion) break;
    SVar15 = (expr->super_Expression).sourceRange.startLoc;
    SVar14 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2f;
    goto LAB_003092bd;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_40);
LAB_00309385:
    if ((0x40 < local_38 || (local_33 & 1) != 0) && ((void *)local_40.val != (void *)0x0)) {
      operator_delete__(local_40.pVal);
    }
    if ((local_33 & 1) == 0) {
      return true;
    }
    this_00 = this->context;
    SVar15 = (expr->super_Expression).sourceRange.startLoc;
    SVar14 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x50;
    goto LAB_003092bd;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case UnaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case MemberAccess:
    break;
  case NamedValue:
  case HierarchicalValue:
    if (this->isTop == false) {
      return true;
    }
    break;
  case BinaryOp:
    EVar10 = expr[1].super_Expression.kind;
    if (EVar10 < DataType) {
      if ((0x79e600U >> (EVar10 & ValueRange) & 1) == 0) {
        if ((0x61800U >> (EVar10 & ValueRange) & 1) != 0) goto switchD_0030926d_caseD_11;
      }
      else if (((bVar13 & 1) != 0) &&
              (((pEVar4 = (Expression *)(expr->operands_)._M_ptr,
                (pEVar4->kind & ~IntegerLiteral) == NamedValue &&
                (bVar8 = checkType(this,pEVar4), !bVar8)) ||
               ((pEVar4 = (Expression *)(expr->operands_)._M_extent._M_extent_value,
                (pEVar4->kind & ~IntegerLiteral) == NamedValue &&
                (bVar8 = checkType(this,pEVar4), !bVar8)))))) goto LAB_00309492;
    }
    break;
  case Streaming:
switchD_0030926d_caseD_11:
    this_00 = this->context;
    SVar15 = (expr->super_Expression).sourceRange.startLoc;
    SVar14 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x18;
LAB_003092bd:
    sourceRange.endLoc = SVar14;
    sourceRange.startLoc = SVar15;
    ASTContext::addDiag(this_00,code,sourceRange);
    goto LAB_00309492;
  case Call:
    SVar11 = CallExpression::getSubroutineKind((CallExpression *)expr);
    if (SVar11 == Task) {
      this_00 = this->context;
      SVar15 = (expr->super_Expression).sourceRange.startLoc;
      SVar14 = (expr->super_Expression).sourceRange.endLoc;
      code.subsystem = Statements;
      code.code = 0x4b;
      goto LAB_003092bd;
    }
    if (*(char *)&expr[1].super_Expression.sourceRange.startLoc != '\x01') {
      ppSVar12 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&expr->operands_);
      pSVar5 = *ppSVar12;
      if ((pSVar5->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar5->super_Scope);
      }
      sVar2 = (pSVar5->arguments)._M_extent._M_extent_value;
      if (sVar2 != 0) {
        lVar16 = 0;
        do {
          lVar6 = *(long *)((long)(pSVar5->arguments)._M_ptr + lVar16);
          iVar1 = *(int *)(lVar6 + 0x158);
          if (iVar1 == 3) {
            if ((*(byte *)(lVar6 + 0x154) & 1) == 0) goto LAB_003094a9;
          }
          else if (iVar1 - 1U < 2) {
LAB_003094a9:
            this_00 = this->context;
            SVar15 = (expr->super_Expression).sourceRange.startLoc;
            SVar14 = (expr->super_Expression).sourceRange.endLoc;
            code.subsystem = Statements;
            code.code = 0x32;
            goto LAB_003092bd;
          }
          lVar16 = lVar16 + 8;
        } while (sVar2 << 3 != lVar16);
      }
    }
    break;
  default:
    switch(EVar10) {
    case ValueRange:
      return true;
    case Dist:
      local_40 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_38 = local_38 & 0xffffff00;
      pEVar4 = (Expression *)(expr->operands_)._M_ptr;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (pEVar4,pEVar4,(DistVarVisitor *)&local_40);
      if ((char)local_38 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x3c0008,pEVar4->sourceRange);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_0030926d_caseD_11;
    }
  }
  bVar8 = checkType(this,&expr->super_Expression);
  if (!bVar8) {
LAB_00309492:
    this->failed = true;
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }